

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O1

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  
  uVar73 = a->n[0];
  uVar1 = a->n[1];
  uVar2 = a->n[2];
  uVar3 = b->n[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar73;
  uVar4 = a->n[3];
  uVar5 = b->n[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar5;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar1;
  uVar6 = a->n[4];
  uVar7 = b->n[0];
  uVar8 = b->n[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar8;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar7;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar4;
  uVar9 = b->n[4];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar9;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar6;
  auVar22 = auVar14 * auVar45 >> 0x34;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SUB168(auVar14 * auVar45,0) & 0xfffffffffffff;
  auVar10 = auVar10 * auVar41 + auVar11 * auVar42 + auVar12 * auVar43 + auVar13 * auVar44 +
            auVar15 * ZEXT816(0x1000003d10);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar9;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar73;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar3;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar5;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar8;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar7;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar6;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar22._0_8_;
  auVar69._8_8_ = auVar22._8_8_ * 0x1000003d10 + SUB168(auVar21 * ZEXT816(0x1000003d10),8);
  auVar69._0_8_ = SUB168(auVar21 * ZEXT816(0x1000003d10),0);
  auVar12 = (auVar10 >> 0x34) +
            auVar20 * auVar50 + auVar19 * auVar49 + auVar17 * auVar47 + auVar18 * auVar48 +
            auVar16 * auVar46 + auVar69;
  auVar70._8_8_ = auVar12._8_8_ >> 0x34;
  auVar70._0_8_ = auVar12._8_8_ * 0x1000 | auVar12._0_8_ >> 0x34;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar7;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar73;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar9;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar3;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar5;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar4;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar8;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar6;
  auVar70 = auVar26 * auVar55 + auVar25 * auVar54 + auVar24 * auVar53 + auVar23 * auVar52 + auVar70;
  uVar72 = auVar70._0_8_;
  uVar75 = auVar70._8_8_;
  auVar71._8_8_ = uVar75 >> 0x34;
  auVar71._0_8_ = uVar75 * 0x1000 | uVar72 >> 0x34;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar72 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar12._6_2_ & 0xf);
  auVar11 = auVar27 * ZEXT816(0x1000003d1) + auVar22 * auVar51;
  uVar72 = auVar11._0_8_;
  uVar75 = auVar11._8_8_;
  auVar67._8_8_ = uVar75 >> 0x34;
  auVar67._0_8_ = uVar75 * 0x1000 | uVar72 >> 0x34;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar8;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar73;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar7;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar9;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar3;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar4;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar5;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar6;
  auVar71 = auVar30 * auVar58 + auVar32 * auVar60 + auVar31 * auVar59 + auVar71;
  uVar75 = auVar71._0_8_;
  uVar74 = auVar71._8_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar75 & 0xfffffffffffff;
  r->n[0] = uVar72 & 0xfffffffffffff;
  auVar67 = auVar29 * auVar57 + auVar28 * auVar56 + auVar33 * ZEXT816(0x1000003d10) + auVar67;
  auVar68._8_8_ = uVar74 >> 0x34;
  auVar68._0_8_ = uVar74 * 0x1000 | uVar75 >> 0x34;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar5;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar73;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar8;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar7;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar9;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar4;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar6;
  r->n[1] = auVar67._0_8_ & 0xfffffffffffff;
  auVar68 = auVar38 * auVar65 + auVar37 * auVar64 + auVar68;
  auVar13 = auVar68 >> 0x34;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar68._0_8_ & 0xfffffffffffff;
  auVar11 = auVar35 * auVar62 + auVar34 * auVar61 + auVar36 * auVar63 +
            auVar39 * ZEXT816(0x1000003d10) + (auVar67 >> 0x34);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar13._0_8_;
  auVar66._8_8_ = auVar13._8_8_ * 0x1000003d10;
  auVar66._0_8_ = auVar10._0_8_ & 0xfffffffffffff;
  r->n[2] = auVar11._0_8_ & 0xfffffffffffff;
  auVar10 = auVar40 * ZEXT816(0x1000003d10) + auVar66 + (auVar11 >> 0x34);
  uVar73 = auVar10._0_8_;
  r->n[3] = uVar73 & 0xfffffffffffff;
  r->n[4] = (auVar12._0_8_ & 0xffffffffffff) + (auVar10._8_8_ << 0xc | uVar73 >> 0x34);
  return;
}

Assistant:

static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
#ifdef VERIFY
    VERIFY_CHECK(a->magnitude <= 8);
    VERIFY_CHECK(b->magnitude <= 8);
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);
#endif
    secp256k1_fe_mul_inner(r->n, a->n, b->n);
#ifdef VERIFY
    r->magnitude = 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
#endif
}